

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_wsi_mux_insert(lws *wsi,lws *parent_wsi,uint sid)

{
  uint *puVar1;
  uint uVar2;
  char *pcVar3;
  lws_log_cx_t *cx;
  
  if (wsi == (lws *)0x0) {
    cx = (lws_log_cx_t *)0x0;
  }
  else {
    cx = (wsi->lc).log_cx;
  }
  if (parent_wsi == (lws *)0x0) {
    pcVar3 = "[null wsi]";
  }
  else {
    pcVar3 = lws_lc_tag(&parent_wsi->lc);
  }
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_wsi_mux_insert","par %s: assign sid %d (curr %d)",
              pcVar3,(ulong)sid,(ulong)(wsi->mux).my_sid);
  uVar2 = (wsi->mux).my_sid;
  if (uVar2 == sid || uVar2 == 0) {
    (wsi->mux).my_sid = sid;
    (wsi->mux).parent_wsi = parent_wsi;
    wsi->role_ops = parent_wsi->role_ops;
    (wsi->mux).sibling_list = (parent_wsi->mux).child_list;
    (parent_wsi->mux).child_list = wsi;
    puVar1 = &(parent_wsi->mux).child_count;
    *puVar1 = *puVar1 + 1;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                ,0x546,"void lws_wsi_mux_insert(struct lws *, struct lws *, unsigned int)");
}

Assistant:

void
lws_wsi_mux_insert(struct lws *wsi, struct lws *parent_wsi, unsigned int sid)
{
	lwsl_wsi_info(wsi, "par %s: assign sid %d (curr %d)",
			lws_wsi_tag(parent_wsi), sid, wsi->mux.my_sid);

	if (wsi->mux.my_sid && wsi->mux.my_sid != (unsigned int)sid)
		assert(0);

	wsi->mux.my_sid = sid;
	wsi->mux.parent_wsi = parent_wsi;
	wsi->role_ops = parent_wsi->role_ops;

	/* new guy's sibling is whoever was the first child before */
	wsi->mux.sibling_list = parent_wsi->mux.child_list;

	/* first child is now the new guy */
	parent_wsi->mux.child_list = wsi;

	parent_wsi->mux.child_count++;
}